

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::D3D5::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,D3D5 *this)

{
  mt19937 *this_00;
  TestOptions *opt;
  uint32_t uVar1;
  MthdD3D56TexFilter *pMVar2;
  MthdD3D56TexFormat *pMVar3;
  MthdCtxSurf3D *pMVar4;
  SingleMthdTest *pSVar5;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar6;
  result_type rVar7;
  MthdDmaGrobj *pMVar8;
  MthdD3D56TexOffset *this_01;
  Test *pTVar9;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_441;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *local_440;
  Test *local_438;
  Test *local_430;
  Test *local_428;
  Test *local_420;
  Test *local_418;
  Test *local_410;
  Test *local_408;
  MthdD3D56TexFilter *local_400;
  MthdD3D56TexFormat *local_3f8;
  Test *local_3f0;
  MthdCtxSurf3D *local_3e8;
  MthdDmaGrobj *local_3e0;
  Test *local_3d8;
  Test *local_3d0;
  SingleMthdTest *local_3c8;
  Test *local_3c0;
  MthdD3D56TexOffset *local_3b8;
  MthdDmaGrobj *local_3b0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_3a8;
  undefined1 *local_3a0;
  long local_398;
  undefined1 local_390 [16];
  undefined1 *local_380;
  long local_378;
  undefined1 local_370 [16];
  undefined1 *local_360;
  long local_358;
  undefined1 local_350 [16];
  undefined1 *local_340;
  long local_338;
  undefined1 local_330 [16];
  undefined1 *local_320;
  long local_318;
  undefined1 local_310 [16];
  undefined1 *local_300;
  long local_2f8;
  undefined1 local_2f0 [16];
  undefined1 *local_2e0;
  long local_2d8;
  undefined1 local_2d0 [16];
  undefined1 *local_2c0;
  long local_2b8;
  undefined1 local_2b0 [16];
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  undefined1 *local_280;
  long local_278;
  undefined1 local_270 [16];
  undefined1 *local_260;
  long local_258;
  undefined1 local_250 [16];
  undefined1 *local_240;
  long local_238;
  undefined1 local_230 [16];
  undefined1 *local_220;
  long local_218;
  undefined1 local_210 [16];
  undefined1 *local_200;
  long local_1f8;
  undefined1 local_1f0 [16];
  undefined1 *local_1e0;
  long local_1d8;
  undefined1 local_1d0 [16];
  undefined1 *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [16];
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  SingleMthdTest *local_e0;
  Test *local_d8;
  Test *local_d0;
  MthdDmaGrobj *local_c8;
  MthdDmaGrobj *local_c0;
  MthdCtxSurf3D *local_b8;
  Test *local_b0;
  MthdD3D56TexOffset *local_a8;
  MthdD3D56TexFormat *local_a0;
  MthdD3D56TexFilter *local_98;
  Test *local_90;
  Test *local_88;
  Test *local_80;
  Test *local_78;
  Test *local_70;
  Test *local_68;
  Test *local_60;
  Test *local_58;
  Test *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  local_3c8 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1c0 = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"nop","");
  pSVar5 = local_3c8;
  opt = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)local_3c8,opt,(uint32_t)rVar7);
  (pSVar5->super_MthdTest).trapbit = -1;
  (pSVar5->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  pSVar5->s_cls = uVar1;
  pSVar5->s_mthd = 0x100;
  pSVar5->s_stride = 4;
  pSVar5->s_num = 1;
  pSVar5->s_trapbit = -1;
  (pSVar5->name)._M_dataplus._M_p = (pointer)&(pSVar5->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&pSVar5->name,local_1c0,local_1c0 + local_1b8)
  ;
  (pSVar5->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_e0 = pSVar5;
  local_3d0 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1e0 = local_1d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"notify","");
  pTVar9 = local_3d0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3d0,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_1e0,local_1e0 + local_1d8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_d8 = pTVar9;
  local_3d8 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_200 = local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"dma_notify","");
  pTVar9 = local_3d8;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3d8,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_200,local_200 + local_1f8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_d0 = pTVar9;
  pMVar8 = (MthdDmaGrobj *)operator_new(0x25960);
  local_3b0 = pMVar8;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"dma_tex_a","");
  MthdDmaGrobj::MthdDmaGrobj
            (pMVar8,opt,(uint32_t)rVar7,&local_100,-1,(this->super_Class).cls,0x184,0,4);
  local_c8 = pMVar8;
  local_3e0 = (MthdDmaGrobj *)operator_new(0x25960);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"dma_tex_b","");
  pMVar8 = local_3e0;
  MthdDmaGrobj::MthdDmaGrobj
            (local_3e0,opt,(uint32_t)rVar7,&local_120,-1,(this->super_Class).cls,0x188,1,4);
  local_c0 = pMVar8;
  local_3e8 = (MthdCtxSurf3D *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"ctx_surf3d","");
  pMVar4 = local_3e8;
  MthdCtxSurf3D::MthdCtxSurf3D
            (local_3e8,opt,(uint32_t)rVar7,&local_140,-1,(this->super_Class).cls,0x18c,0);
  local_b8 = pMVar4;
  local_3f0 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_220 = local_210;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"tex_color_key","");
  pTVar9 = local_3f0;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_3f0,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x300;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_220,local_220 + local_218);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003510a8;
  local_b0 = pTVar9;
  this_01 = (MthdD3D56TexOffset *)operator_new(0x25958);
  local_3b8 = this_01;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"tex_offset","");
  MthdD3D56TexOffset::MthdD3D56TexOffset
            (this_01,opt,(uint32_t)rVar7,&local_160,-1,(this->super_Class).cls,0x304,3);
  local_a8 = this_01;
  local_3f8 = (MthdD3D56TexFormat *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"tex_format","");
  pMVar3 = local_3f8;
  MthdD3D56TexFormat::MthdD3D56TexFormat
            (local_3f8,opt,(uint32_t)rVar7,&local_180,-1,(this->super_Class).cls,0x308,3);
  local_a0 = pMVar3;
  local_400 = (MthdD3D56TexFilter *)operator_new(0x25958);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"tex_filter","");
  pMVar2 = local_400;
  MthdD3D56TexFilter::MthdD3D56TexFilter
            (local_400,opt,(uint32_t)rVar7,&local_1a0,-1,(this->super_Class).cls,0x30c,3);
  local_98 = pMVar2;
  local_408 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_240 = local_230;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"blend","");
  pTVar9 = local_408;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_408,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x310;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_240,local_240 + local_238);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351390;
  local_90 = pTVar9;
  local_410 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_260 = local_250;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"config","");
  pTVar9 = local_410;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_410,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x314;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_260,local_260 + local_258);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351488;
  local_88 = pTVar9;
  local_418 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_280 = local_270;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"fog_color","");
  pTVar9 = local_418;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_418,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x318;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_280,local_280 + local_278);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_003506f8;
  local_80 = pTVar9;
  local_420 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2a0 = local_290;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"tlv_x","");
  pTVar9 = local_420;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_420,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x400;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_2a0,local_2a0 + local_298);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350bd0;
  local_78 = pTVar9;
  local_428 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2c0 = local_2b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c0,"tlv_y","");
  pTVar9 = local_428;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_428,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x404;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_2c0,local_2c0 + local_2b8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350cc8;
  local_70 = pTVar9;
  local_430 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_2e0 = local_2d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"tlv_z","");
  pTVar9 = local_430;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_430,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x408;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_2e0,local_2e0 + local_2d8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350dc0;
  local_68 = pTVar9;
  local_438 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_300 = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"tlv_rhw","");
  pTVar9 = local_438;
  uVar1 = (this->super_Class).cls;
  Test::Test(local_438,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x40c;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_300,local_300 + local_2f8);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350eb8;
  local_60 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25950);
  local_3c0 = pTVar9;
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_320 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"tlv_color","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x410;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_320,local_320 + local_318);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350ad8;
  local_58 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_340 = local_330;
  local_440 = this_00;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"tlv_fog_col1","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x414;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_340,local_340 + local_338);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00351580;
  local_50 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25960);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_440);
  local_360 = local_350;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"tlv_u","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x418;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_360,local_360 + local_358);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350fb0;
  pTVar9[0x1e].rnd._M_x[0x119] = 0;
  *(undefined1 *)(pTVar9[0x1e].rnd._M_x + 0x11a) = 0;
  local_48 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25960);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_440);
  local_380 = local_370;
  local_3a8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"tlv_v","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x41c;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 0x20;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x10;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_380,local_380 + local_378);
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00350fb0;
  pTVar9[0x1e].rnd._M_x[0x119] = 1;
  *(undefined1 *)(pTVar9[0x1e].rnd._M_x + 0x11a) = 1;
  local_40 = pTVar9;
  pTVar9 = (Test *)operator_new(0x25950);
  rVar7 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(local_440);
  local_3a0 = local_390;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"draw","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar9,opt,(uint32_t)rVar7);
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar9[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x894) = 0x600;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar9[0x1e].rnd._M_x + 0x89c) = 0x40;
  *(undefined4 *)(pTVar9[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar9[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar9[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar9[0x1e].rnd._M_x + 0x115),local_3a0,local_3a0 + local_398);
  pvVar6 = local_3a8;
  pTVar9->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034d010;
  __l._M_len = 0x16;
  __l._M_array = &local_e0;
  local_38 = pTVar9;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_3a8,__l,&local_441);
  if (local_3a0 != local_390) {
    operator_delete(local_3a0);
  }
  if (local_380 != local_370) {
    operator_delete(local_380);
  }
  if (local_360 != local_350) {
    operator_delete(local_360);
  }
  if (local_340 != local_330) {
    operator_delete(local_340);
  }
  if (local_320 != local_310) {
    operator_delete(local_320);
  }
  if (local_300 != local_2f0) {
    operator_delete(local_300);
  }
  if (local_2e0 != local_2d0) {
    operator_delete(local_2e0);
  }
  if (local_2c0 != local_2b0) {
    operator_delete(local_2c0);
  }
  if (local_2a0 != local_290) {
    operator_delete(local_2a0);
  }
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if (local_260 != local_250) {
    operator_delete(local_260);
  }
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  if (local_220 != local_210) {
    operator_delete(local_220);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  if (local_200 != local_1f0) {
    operator_delete(local_200);
  }
  if (local_1e0 != local_1d0) {
    operator_delete(local_1e0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  return pvVar6;
}

Assistant:

std::vector<SingleMthdTest *> D3D5::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", -1, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", -1, cls, 0x180),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_a", -1, cls, 0x184, 0, DMA_R | DMA_ALIGN),
		new MthdDmaGrobj(opt, rnd(), "dma_tex_b", -1, cls, 0x188, 1, DMA_R | DMA_ALIGN),
		new MthdCtxSurf3D(opt, rnd(), "ctx_surf3d", -1, cls, 0x18c, SURF2D_NV4),
		new MthdD3D56TexColorKey(opt, rnd(), "tex_color_key", -1, cls, 0x300),
		new MthdD3D56TexOffset(opt, rnd(), "tex_offset", -1, cls, 0x304, 3),
		new MthdD3D56TexFormat(opt, rnd(), "tex_format", -1, cls, 0x308, 3),
		new MthdD3D56TexFilter(opt, rnd(), "tex_filter", -1, cls, 0x30c, 3),
		new MthdD3D56Blend(opt, rnd(), "blend", -1, cls, 0x310),
		new MthdD3D56Config(opt, rnd(), "config", -1, cls, 0x314),
		new MthdD3D56FogColor(opt, rnd(), "fog_color", -1, cls, 0x318),
		new MthdD3D56TlvX(opt, rnd(), "tlv_x", -1, cls, 0x400, 0x10, 0x20),
		new MthdD3D56TlvY(opt, rnd(), "tlv_y", -1, cls, 0x404, 0x10, 0x20),
		new MthdD3D56TlvZ(opt, rnd(), "tlv_z", -1, cls, 0x408, 0x10, 0x20),
		new MthdD3D56TlvRhw(opt, rnd(), "tlv_rhw", -1, cls, 0x40c, 0x10, 0x20),
		new MthdD3D56TlvColor(opt, rnd(), "tlv_color", -1, cls, 0x410, 0x10, 0x20),
		new MthdD3D56TlvFogCol1(opt, rnd(), "tlv_fog_col1", -1, cls, 0x414, 0x10, 0x20),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_u", -1, cls, 0x418, 0x10, 0x20, 0, 0, false),
		new MthdD3D56TlvUv(opt, rnd(), "tlv_v", -1, cls, 0x41c, 0x10, 0x20, 0, 1, true),
		new UntestedMthd(opt, rnd(), "draw", -1, cls, 0x600, 0x40),
	};
}